

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O2

bool __thiscall
Js::FunctionBody::NeedScopeObjectForArguments(FunctionBody *this,bool hasNonSimpleParams)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  byte bVar4;
  
  if ((this->field_0x17b & 2) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0xb70,"(HasReferenceableBuiltInArguments())",
                                "HasReferenceableBuiltInArguments()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar4 = 1;
  if (((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 1) != 0 ||
      hasNonSimpleParams) {
    bVar4 = this->hasScopeObject;
  }
  return (bool)(((char)(this->super_ParseableFunctionInfo).flags < '\0' ||
                1 < (this->super_ParseableFunctionInfo).m_inParamCount) & bVar4);
}

Assistant:

bool NeedScopeObjectForArguments(bool hasNonSimpleParams)
        {
            Assert(HasReferenceableBuiltInArguments());
            // We can avoid creating a scope object with arguments present if:
            bool dontNeedScopeObject =
                // Either we are in strict mode, or have strict mode formal semantics from a non-simple parameter list, and
                (GetIsStrictMode() || hasNonSimpleParams)
                // Neither of the scopes are objects
                && !HasScopeObject();

            return
                // Regardless of the conditions above, we won't need a scope object if there aren't any formals.
                (GetInParamsCount() > 1 || GetHasRestParameter())
                && !dontNeedScopeObject;
        }